

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O3

void __thiscall xmrig::OclBackendPrivate::start(OclBackendPrivate *this,Job *job)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  pointer pOVar6;
  bool bVar7;
  char *pcVar8;
  char cVar9;
  char cVar10;
  long lVar11;
  uint uVar12;
  _Alloc_hider _Var13;
  pointer pOVar14;
  long local_90;
  string __str;
  undefined1 local_50 [16];
  char *local_40;
  
  Log::print("\x1b[1;37m|  # | GPU |  BUS ID |    I |  W | SI | MC |  U |  MEM | NAME\x1b[0m");
  pOVar14 = (this->threads).
            super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
            super__Vector_impl_data._M_start;
  pOVar6 = (this->threads).
           super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pOVar14 != pOVar6) {
    local_90 = 0;
    do {
      uVar1 = (pOVar14->thread).m_index;
      PciTopology::toString((PciTopology *)&local_40);
      pcVar8 = local_40;
      uVar2 = (pOVar14->thread).m_intensity;
      uVar3 = (pOVar14->thread).m_stridedIndex;
      uVar4 = (pOVar14->thread).m_worksize;
      _Var13._M_p = "-";
      uVar5 = uVar2;
      if (uVar3 == 2) {
        uVar5 = (pOVar14->thread).m_memChunk;
        cVar10 = '\x01';
        if (9 < uVar5) {
          uVar12 = uVar5;
          cVar9 = '\x04';
          do {
            cVar10 = cVar9;
            if (uVar12 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_0016022b;
            }
            if (uVar12 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_0016022b;
            }
            if (uVar12 < 10000) goto LAB_0016022b;
            bVar7 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar9 = cVar10 + '\x04';
          } while (bVar7);
          cVar10 = cVar10 + '\x01';
        }
LAB_0016022b:
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct((ulong)&__str,cVar10);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar5);
        uVar5 = (pOVar14->thread).m_intensity;
        _Var13 = __str._M_dataplus;
      }
      uVar12 = (pOVar14->thread).m_unrollFactor;
      OclDevice::printableName((OclDevice *)local_50);
      Log::print("|\x1b[1;36m%3zu\x1b[0m |\x1b[1;36m%4u\x1b[0m |\x1b[0;33m %7s\x1b[0m |\x1b[1;36m%5u\x1b[0m |\x1b[1;36m%3u\x1b[0m |\x1b[1;36m%3u\x1b[0m |\x1b[1;36m%3s\x1b[0m |\x1b[1;36m%3u\x1b[0m |\x1b[0;36m%5zu\x1b[0m | %s"
                 ,local_90,(ulong)uVar1,pcVar8,(ulong)uVar2,(ulong)uVar4,(ulong)uVar3,_Var13._M_p,
                 (ulong)uVar12,(ulong)uVar5,local_50._0_8_);
      if ((cl_device_id)local_50._0_8_ != (cl_device_id)0x0) {
        operator_delete__((void *)local_50._0_8_);
      }
      if ((uVar3 == 2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2)) {
        operator_delete(__str._M_dataplus._M_p);
      }
      if (local_40 != (char *)0x0) {
        operator_delete__(local_40);
      }
      local_90 = local_90 + 1;
      pOVar14 = pOVar14 + 1;
    } while (pOVar14 != pOVar6);
  }
  OclSharedState::start(&this->threads,job);
  pOVar14 = (this->threads).
            super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pOVar6 = (this->threads).
           super__Vector_base<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->status).m_errors = 0;
  (this->status).m_started = 0;
  (this->status).m_threads = ((long)pOVar14 - (long)pOVar6 >> 5) * 0x6db6db6db6db6db7;
  lVar11 = std::chrono::_V2::steady_clock::now();
  (this->status).m_ts = lVar11 / 1000000;
  LOCK();
  OclWorker::ready = 0;
  UNLOCK();
  Workers<xmrig::OclLaunchData>::start(&this->workers,&this->threads);
  return;
}

Assistant:

inline void start(const Job &job)
    {
        Log::print(WHITE_BOLD("|  # | GPU |  BUS ID |    I |  W | SI | MC |  U |  MEM | NAME"));

        size_t i = 0;
        for (const auto &data : threads) {
            Log::print("|" CYAN_BOLD("%3zu") " |" CYAN_BOLD("%4u") " |" YELLOW(" %7s") " |" CYAN_BOLD("%5u") " |" CYAN_BOLD("%3u") " |"
                       CYAN_BOLD("%3u") " |" CYAN_BOLD("%3s") " |" CYAN_BOLD("%3u") " |" CYAN("%5zu") " | %s",
                       i,
                       data.thread.index(),
                       data.device.topology().toString().data(),
                       data.thread.intensity(),
                       data.thread.worksize(),
                       data.thread.stridedIndex(),
                       data.thread.stridedIndex() == 2 ? std::to_string(data.thread.memChunk()).c_str() : "-",
                       data.thread.unrollFactor(),
                       data.thread.intensity(),
                       data.device.printableName().data()
                       );

                    i++;
        }

        OclSharedState::start(threads, job);

        status.start(threads.size());
        workers.start(threads);
    }